

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors.cpp
# Opt level: O2

int __thiscall SensorBase::init(SensorBase *this,EVP_PKEY_CTX *ctx)

{
  path *this_00;
  path *this_01;
  string *__lhs;
  int iVar1;
  mapped_type *pmVar2;
  path scale_path;
  float local_c8 [10];
  path offset_path;
  path name_path;
  float local_50 [8];
  
  std::__cxx11::to_string(&scale_path._M_pathname,(int)ctx);
  std::operator+(&name_path._M_pathname,"/sys/bus/iio/devices/iio:device",&scale_path._M_pathname);
  this_00 = &this->sysfspath;
  std::filesystem::__cxx11::path::operator=(this_00,&name_path._M_pathname);
  std::__cxx11::string::~string((string *)&name_path);
  std::__cxx11::string::~string((string *)&scale_path);
  std::__cxx11::to_string(&scale_path._M_pathname,(int)ctx);
  std::operator+(&name_path._M_pathname,"/dev/iio:device",&scale_path._M_pathname);
  this_01 = &this->devbufpath;
  std::filesystem::__cxx11::path::operator=(this_01,&name_path._M_pathname);
  std::__cxx11::string::~string((string *)&name_path);
  std::__cxx11::string::~string((string *)&scale_path);
  __lhs = &this->sensor_basename;
  std::__cxx11::string::_M_assign((string *)__lhs);
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (&scale_path,(char (*) [5])"name",auto_format);
  std::filesystem::__cxx11::operator/(&name_path,this_00,&scale_path);
  std::filesystem::__cxx11::path::~path(&scale_path);
  readstr_abi_cxx11_(&scale_path._M_pathname,name_path._M_pathname._M_dataplus._M_p,0x100);
  std::__cxx11::string::operator=((string *)&this->type,(string *)&scale_path);
  std::__cxx11::string::~string((string *)&scale_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,__lhs
                 ,"_scale");
  std::filesystem::__cxx11::path::path(&offset_path,(string_type *)local_c8,auto_format);
  std::filesystem::__cxx11::operator/(&scale_path,this_00,&offset_path);
  std::filesystem::__cxx11::path::~path(&offset_path);
  std::__cxx11::string::~string((string *)local_c8);
  local_c8[0] = readfloat(scale_path._M_pathname._M_dataplus._M_p);
  std::operator+(&offset_path._M_pathname,__lhs,"_scale");
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->dict,&offset_path._M_pathname);
  std::any::operator=(pmVar2,local_c8);
  std::__cxx11::string::~string((string *)&offset_path);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,__lhs
                 ,"_offset");
  std::filesystem::__cxx11::path::path((path *)local_c8,(string_type *)local_50,auto_format);
  std::filesystem::__cxx11::operator/(&offset_path,this_00,(path *)local_c8);
  std::filesystem::__cxx11::path::~path((path *)local_c8);
  std::__cxx11::string::~string((string *)local_50);
  local_50[0] = readfloat(offset_path._M_pathname._M_dataplus._M_p);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,__lhs
                 ,"_offset");
  pmVar2 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->dict,(key_type *)local_c8);
  std::any::operator=(pmVar2,local_50);
  std::__cxx11::string::~string((string *)local_c8);
  reset(this);
  pipe(this->qpipe);
  std::
  vector<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>,_std::allocator<std::tuple<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scan_t>_>_>
  ::clear(&this->enabled_scan_elem);
  (**this->_vptr_SensorBase)(this);
  (*this->_vptr_SensorBase[1])(this);
  enable_buffer(this);
  iVar1 = open((this_01->_M_pathname)._M_dataplus._M_p,0);
  this->devfd = iVar1;
  if (iVar1 == -1) {
    fprintf(_stderr,"%c: failed to open the iio buffer device: %s\n",0x45,
            (this_01->_M_pathname)._M_dataplus._M_p);
  }
  std::filesystem::__cxx11::path::~path(&offset_path);
  std::filesystem::__cxx11::path::~path(&scale_path);
  std::filesystem::__cxx11::path::~path(&name_path);
  return (int)CONCAT71((int7)((ulong)this >> 8),iVar1 == -1);
}

Assistant:

bool SensorBase::init(int id,std::string _sensor_basename)
{
	sysfspath=IIODEV_SYSFS_PATH_BASE+std::to_string(id);
	devbufpath=DEV_PATH+std::to_string(id);
	sensor_basename=_sensor_basename;

	using filesystem::path;
	path name_path=sysfspath/"name";
	type=readstr(name_path.c_str());
	path scale_path=sysfspath/(sensor_basename+"_scale");
	dict[sensor_basename+"_scale"]=readfloat(scale_path.c_str());
	path offset_path=sysfspath/(sensor_basename+"_offset");
	dict[sensor_basename+"_offset"]=readfloat(offset_path.c_str());

	reset();
	ignore_result(pipe(qpipe));
	enabled_scan_elem.clear();
	enable_scan_elements();
	update_values();
	enable_buffer();
	devfd=open(devbufpath.c_str(),O_RDONLY);
	if(!~devfd)
		return LOG('E',"failed to open the iio buffer device: %s",devbufpath.c_str()),1;
	return 0;
}